

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_impl_avx2.c
# Opt level: O3

uint aom_sad128x128_avg_avx2
               (uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride,uint8_t *second_pred
               )

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = aom_sad128x64_avg_avx2(src_ptr,src_stride,ref_ptr,ref_stride,second_pred);
  uVar2 = aom_sad128x64_avg_avx2
                    (src_ptr + (src_stride << 6),src_stride,ref_ptr + (ref_stride << 6),ref_stride,
                     second_pred + 0x2000);
  return uVar2 + uVar1;
}

Assistant:

unsigned int aom_sad128x128_avg_avx2(const uint8_t *src_ptr, int src_stride,
                                     const uint8_t *ref_ptr, int ref_stride,
                                     const uint8_t *second_pred) {
  uint32_t sum = aom_sad128x64_avg_avx2(src_ptr, src_stride, ref_ptr,
                                        ref_stride, second_pred);
  src_ptr += src_stride << 6;
  ref_ptr += ref_stride << 6;
  second_pred += 128 << 6;
  sum += aom_sad128x64_avg_avx2(src_ptr, src_stride, ref_ptr, ref_stride,
                                second_pred);
  return sum;
}